

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O2

method class_get_method_type_safe(vector v,type_id ret,type_id *args,size_t size)

{
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  signature s;
  method_conflict m;
  size_t position;
  
  if (v == (vector)0x0) {
    m = (method_conflict)0x0;
  }
  else {
    sVar2 = vector_size(v);
    position = 0;
    do {
      if (sVar2 == position) {
        m = (method_conflict)0x0;
        break;
      }
      puVar3 = (undefined8 *)vector_at(v,position);
      m = (method_conflict)*puVar3;
      s = method_signature(m);
      iVar1 = signature_compare(s,ret,args,size);
      position = position + 1;
    } while (iVar1 != 0);
    vector_destroy(v);
  }
  return m;
}

Assistant:

method class_get_method_type_safe(vector v, type_id ret, type_id args[], size_t size)
{
	if (v != NULL)
	{
		size_t iterator, method_size = vector_size(v);

		for (iterator = 0; iterator < method_size; ++iterator)
		{
			method m = vector_at_type(v, iterator, method);

			if (signature_compare(method_signature(m), ret, args, size) == 0)
			{
				vector_destroy(v);
				return m;
			}
		}

		vector_destroy(v);
	}

	return NULL;
}